

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

bool tinyusdz::srgb_8bit_to_linear_8bit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_img,size_t width,
               size_t height,size_t channels,size_t channel_stride,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out_img,string *err)

{
  value_type vVar1;
  uint8_t uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  byte *pbVar6;
  reference pvVar7;
  const_reference pvVar8;
  float x_00;
  float local_bc4;
  size_t idx_1;
  size_t c_1;
  size_t idx;
  size_t c;
  size_t x;
  size_t y;
  ulong uStack_b80;
  float f;
  size_t u;
  uint8_t linearlization_table [256];
  string local_a70 [32];
  size_type local_a50;
  allocator local_a41;
  string local_a40 [32];
  string local_a20;
  ostringstream local_a00 [8];
  ostringstream ss_e_5;
  undefined1 local_888 [8];
  size_t dest_size;
  allocator local_859;
  string local_858 [32];
  string local_838;
  ostringstream local_818 [8];
  ostringstream ss_e_4;
  string local_6a0 [32];
  ostringstream local_680 [8];
  ostringstream ss_e_3;
  string local_508 [32];
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_img_local;
  size_t channel_stride_local;
  size_t channels_local;
  size_t height_local;
  size_t width_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_img_local;
  
  out_img_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)channel_stride;
  channel_stride_local = channels;
  channels_local = height;
  height_local = width;
  width_local = (size_t)in_img;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x214);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1b8,"width is zero.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_350);
    poVar3 = ::std::operator<<((ostream *)local_350,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x218);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_350,"height is zero.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_370);
      ::std::__cxx11::string::~string(local_370);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_4e8);
    poVar3 = ::std::operator<<((ostream *)local_4e8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x21c);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_4e8,"channels is zero.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_508);
      ::std::__cxx11::string::~string(local_508);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
  }
  else if (out_img == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_680);
    poVar3 = ::std::operator<<((ostream *)local_680,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x220);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_680,"`out_img` is nullptr.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_6a0);
      ::std::__cxx11::string::~string(local_6a0);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_680);
  }
  else {
    out_img_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)channels;
    if ((channel_stride == 0) ||
       (out_img_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)channel_stride,
       channels <= channel_stride)) {
      uVar4 = width * height * (long)out_img_local;
      local_888 = (undefined1  [8])uVar4;
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_img);
      if (sVar5 < uVar4) {
        ::std::__cxx11::ostringstream::ostringstream(local_a00);
        poVar3 = ::std::operator<<((ostream *)local_a00,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x22d);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a40,
                   "Insufficient input buffer size. must be the same or larger than {} but has {}",
                   &local_a41);
        local_a50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)width_local)
        ;
        fmt::format<unsigned_long,unsigned_long>
                  (&local_a20,(fmt *)local_a40,(string *)local_888,&local_a50,
                   (unsigned_long *)channel_stride);
        poVar3 = ::std::operator<<((ostream *)local_a00,(string *)&local_a20);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)&local_a20);
        ::std::__cxx11::string::~string(local_a40);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a41);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_a70);
          ::std::__cxx11::string::~string(local_a70);
        }
        in_img_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a00);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_img,
                   (size_type)local_888);
        for (uStack_b80 = 0; uStack_b80 < 0x100; uStack_b80 = uStack_b80 + 1) {
          local_bc4 = (float)uStack_b80;
          x_00 = SrgbTransform::srgbToLinear(local_bc4 / 255.0);
          uVar2 = detail::f32_to_u8(x_00);
          linearlization_table[uStack_b80 - 8] = uVar2;
        }
        for (x = 0; x < channels_local; x = x + 1) {
          for (c = 0; c < height_local; c = c + 1) {
            for (idx = 0; idx < channel_stride_local; idx = idx + 1) {
              sVar5 = (long)out_img_local * height_local * x + (long)out_img_local * c + idx;
              pbVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  width_local,sVar5);
              vVar1 = linearlization_table[(ulong)*pbVar6 - 8];
              pvVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (out_img,sVar5);
              *pvVar7 = vVar1;
            }
            for (idx_1 = channel_stride_local; idx_1 < out_img_local; idx_1 = idx_1 + 1) {
              sVar5 = (long)out_img_local * height_local * x + (long)out_img_local * c + idx_1;
              pvVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  width_local,sVar5);
              vVar1 = *pvVar8;
              pvVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (out_img,sVar5);
              *pvVar7 = vVar1;
            }
          }
        }
        in_img_local._7_1_ = 1;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_818);
      poVar3 = ::std::operator<<((ostream *)local_818,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"srgb_8bit_to_linear_8bit");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x227);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_858,"channel_stride {} is smaller than input channels {}",&local_859);
      fmt::format<unsigned_long,unsigned_long>
                (&local_838,(fmt *)local_858,(string *)&out_img_local,&channel_stride_local,
                 (unsigned_long *)channel_stride);
      poVar3 = ::std::operator<<((ostream *)local_818,(string *)&local_838);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)&local_838);
      ::std::__cxx11::string::~string(local_858);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&dest_size);
        ::std::__cxx11::string::~string((string *)&dest_size);
      }
      in_img_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_818);
    }
  }
  return (bool)(in_img_local._7_1_ & 1);
}

Assistant:

bool srgb_8bit_to_linear_8bit(const std::vector<uint8_t> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<uint8_t> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // TODO: Precompute table.
  uint8_t linearlization_table[256];
  for (size_t u = 0; u < 256; u++) {
    float f = float(u) / 255.0f;
    linearlization_table[u] = detail::f32_to_u8(SrgbTransform::srgbToLinear(f));
  }

  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = linearlization_table[in_img[idx]];
      }

      // remainder(usually alpha channel)
      // no op.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = in_img[idx];
      }
    }
  }

  return true;
}